

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O2

double units::precise::equations::convert_equnit_to_value(double val,unit_data *UT)

{
  int iVar1;
  undefined1 *__x;
  double dVar2;
  double dVar3;
  
  if (-1 < (int)*UT) {
    return val;
  }
  iVar1 = custom::eq_type(UT);
  switch(iVar1) {
  case 0:
  case 10:
    break;
  case 1:
    if (((uint)*UT & 0xfffffff) == 0x1d2) {
      dVar3 = 0.5;
    }
    else {
      dVar3 = *(double *)(&DAT_00131430 + (ulong)(((uint)*UT & 0xc000000) == 0x8000000) * 8);
    }
    val = val / dVar3;
    goto switchD_0010db14_caseD_9;
  case 2:
    if (((uint)*UT & 0xfffffff) == 0x1d2) {
      dVar3 = 1.0;
    }
    else {
      dVar3 = *(double *)(&DAT_00131420 + (ulong)(((uint)*UT & 0xc000000) == 0x8000000) * 8);
    }
    val = val / dVar3;
    break;
  case 3:
    __x = (undefined1 *)0x4024000000000000;
    dVar3 = 10.0;
    if (((uint)*UT & 0xfffffff) != 0x1d2) {
      dVar3 = *(double *)(&DAT_00131410 + (ulong)(((uint)*UT & 0xc000000) == 0x8000000) * 8);
    }
    val = val / dVar3;
    goto LAB_0010ddc2;
  case 4:
    val = -val;
    break;
  case 5:
    val = -val;
    __x = &DAT_4059000000000000;
    goto LAB_0010ddc2;
  case 6:
    val = -val;
    __x = (undefined1 *)0x408f400000000000;
    goto LAB_0010ddc2;
  case 7:
    val = -val;
    __x = (undefined1 *)0x40e86a0000000000;
    goto LAB_0010ddc2;
  case 8:
    dVar3 = exp2(val);
    return dVar3;
  case 9:
    goto switchD_0010db14_caseD_9;
  case 0xb:
    __x = (undefined1 *)0x4024000000000000;
    val = val / 10.0;
    goto LAB_0010ddc2;
  case 0xc:
    val = val * 0.5;
    break;
  case 0xd:
    val = val / 20.0;
    break;
  case 0xe:
    __x = (undefined1 *)0x4008000000000000;
    goto LAB_0010ddc2;
  case 0xf:
    val = val + val;
    goto switchD_0010db14_caseD_9;
  case 0x10:
    dVar2 = val + 131.5;
    dVar3 = 141.5;
    goto LAB_0010dd50;
  case 0x11:
    dVar2 = val + 130.0;
    dVar3 = 140.0;
LAB_0010dd50:
    return dVar3 / dVar2;
  case 0x12:
    return 145.0 / (145.0 - val);
  default:
    return val;
  case 0x16:
    dVar3 = fma(val,-0.17613636364,2.8851010101);
    dVar3 = fma(dVar3,val,-14.95265151515);
    dVar3 = fma(dVar3,val,47.85191197691);
    dVar2 = 38.90151515152;
    goto LAB_0010dda0;
  case 0x17:
    dVar3 = fma(val,0.00177396133,-0.05860071301);
    dVar3 = fma(dVar3,val,0.93621452077);
    dVar3 = fma(dVar3,val,0.2424609704);
    dVar2 = -0.12475759535;
LAB_0010dda0:
    dVar3 = fma(dVar3,val,dVar2);
    return dVar3;
  case 0x18:
    dVar3 = pow(val + 2.0,1.5);
    return dVar3 * 14.1;
  case 0x1b:
    dVar3 = atan(val / 100.0);
    return dVar3;
  case 0x1d:
    dVar3 = val + 10.7;
    goto LAB_0010dcbf;
  case 0x1e:
    dVar3 = val + 3.2;
LAB_0010dcbf:
    val = dVar3 * 1.5;
  }
  __x = (undefined1 *)0x4024000000000000;
LAB_0010ddc2:
  dVar3 = pow((double)__x,val);
  return dVar3;
switchD_0010db14_caseD_9:
  dVar3 = exp(val);
  return dVar3;
}

Assistant:

inline double
            convert_equnit_to_value(double val, const detail::unit_data& UT)
        {
            if (!UT.is_equation()) {
                return val;
            }
            int logtype = custom::eq_type(UT);
            switch (logtype) {
                case 0:
                case 10:
                    return std::pow(10.0, val);
                case 1:
                    return std::exp(val / ((is_power_unit(UT)) ? 0.5 : 1.0));
                case 2:
                    return std::pow(
                        10.0, val / ((is_power_unit(UT)) ? 1.0 : 2.0));
                case 3:
                    return std::pow(
                        10.0, val / ((is_power_unit(UT)) ? 10.0 : 20.0));
                case 4:
                    return std::pow(10.0, -val);
                case 5:
                    return std::pow(100.0, -val);
                case 6:
                    return std::pow(1000.0, -val);
                case 7:
                    return std::pow(50000.0, -val);
                case 8:
                    return std::exp2(val);
                case 9:
                    return std::exp(val);
                case 11:
                    return std::pow(10.0, val / 10.0);
                case 12:
                    return std::pow(10.0, val / 2.0);
                case 13:
                    return std::pow(10.0, val / 20.0);
                case 14:
                    return std::pow(3.0, val);
                case 15:
                    return std::exp(val / 0.5);
                case 16:  // API Gravity
                    return 141.5 / (val + 131.5);
                case 17:  // degrees Baume Light
                    return 140.0 / (130.0 + val);
                case 18:  // degrees Baume Heavy
                    return 145.0 / (145.0 - val);
                case 22:  // saffir simpson hurricane wind scale
                {
                    double out = -0.17613636364;
                    out = std::fma(out, val, 2.88510101010);
                    out = std::fma(out, val, -14.95265151515);
                    out = std::fma(out, val, 47.85191197691);
                    out = std::fma(out, val, 38.90151515152);
                    return out;
                }
                case 23: {  // Beaufort wind scale
                    double out = 0.00177396133;
                    out = std::fma(out, val, -0.05860071301);
                    out = std::fma(out, val, 0.93621452077);
                    out = std::fma(out, val, 0.24246097040);
                    out = std::fma(out, val, -0.12475759535);
                    return out;
                }
                case 24:  // Fujita scale
                    return 14.1 * std::pow(val + 2.0, 1.5);
                case 27:  // prism diopter
                    return std::atan(val / 100.0);
                case 29:  // moment magnitude scale
                    return std::pow(10.0, (val + 10.7) * 1.5);
                case 30:
                    return std::pow(10.0, (val + 3.2) * 1.5);
                default:
                    return val;
            }
        }